

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_4,_2> *value)

{
  undefined7 uVar1;
  long lVar2;
  IVal *pIVar3;
  IVal *pIVar4;
  Vector<tcu::Interval,_4> *pVVar5;
  byte bVar6;
  Vector<float,_4> local_98;
  IVal local_88;
  
  bVar6 = 0;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  local_98.m_data._0_8_ = *(undefined8 *)(value->m_data).m_data[0].m_data;
  local_98.m_data._8_8_ = *(undefined8 *)((value->m_data).m_data[0].m_data + 2);
  ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
            (&local_88,fmt,&local_98);
  pIVar3 = &local_88;
  pIVar4 = __return_storage_ptr__;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined7 *)&pIVar3->m_data[0].field_0x1;
    (pIVar4->m_data).m_data[0].m_data[0].m_hasNaN = pIVar3->m_data[0].m_hasNaN;
    *(undefined7 *)&(pIVar4->m_data).m_data[0].m_data[0].field_0x1 = uVar1;
    pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  local_98.m_data._0_8_ = *(undefined8 *)(value->m_data).m_data[1].m_data;
  local_98.m_data._8_8_ = *(undefined8 *)((value->m_data).m_data[1].m_data + 2);
  ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
            (&local_88,fmt,&local_98);
  pIVar3 = &local_88;
  pVVar5 = (__return_storage_ptr__->m_data).m_data + 1;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined7 *)&pIVar3->m_data[0].field_0x1;
    pVVar5->m_data[0].m_hasNaN = pIVar3->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar5->m_data[0].field_0x1 = uVar1;
    pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    pVVar5 = (Vector<tcu::Interval,_4> *)((long)pVVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}